

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

int memory_not_equal_display_error(char *a,char *b,size_t size)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  if (size != 0) {
    sVar2 = 0;
    do {
      sVar1 = sVar1 + (a[sVar2] == b[sVar2]);
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
  }
  if (sVar1 == size) {
    cm_print_error("%zdbytes of %p and %p the same\n",sVar1,a);
  }
  return (uint)(sVar1 != size);
}

Assistant:

static int memory_not_equal_display_error(
        const char* const a, const char* const b, const size_t size) {
    size_t same = 0;
    size_t i;
    for (i = 0; i < size; i++) {
        const char l = a[i];
        const char r = b[i];
        if (l == r) {
            same ++;
        }
    }
    if (same == size) {
        cm_print_error("%"PRIdS "bytes of %p and %p the same\n",
                       same, (void *)a, (void *)b);
        return 0;
    }
    return 1;
}